

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_cons_op(sexp ctx,sexp self,sexp_sint_t n,sexp head,sexp tail)

{
  sexp psVar1;
  
  psVar1 = (sexp)sexp_alloc(ctx,0x20);
  if ((psVar1 != (sexp)0x0) && ((((ulong)psVar1 & 3) != 0 || (psVar1->tag != 0x13)))) {
    psVar1->tag = 6;
  }
  if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
    (psVar1->value).type.name = head;
    (psVar1->value).type.cpl = tail;
    (psVar1->value).uvector.length = 0x3e;
  }
  return psVar1;
}

Assistant:

sexp sexp_cons_op (sexp ctx, sexp self, sexp_sint_t n, sexp head, sexp tail) {
  sexp pair = sexp_alloc_type(ctx, pair, SEXP_PAIR);
  if (sexp_exceptionp(pair)) return pair;
  sexp_car(pair) = head;
  sexp_cdr(pair) = tail;
  sexp_pair_source(pair) = SEXP_FALSE;
  return pair;
}